

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Imputer.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::Imputer::MergePartialFromCodedStream(Imputer *this,CodedInputStream *input)

{
  ImputedValueUnion *this_00;
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  ImputedValueUnion *pIVar4;
  uint8 *puVar5;
  ReplaceValueUnion *pRVar6;
  bool bVar7;
  uint32 uVar8;
  StringToDoubleMap *this_01;
  ulong extraout_RAX;
  Int64ToDoubleMap *this_02;
  ulong extraout_RAX_00;
  DoubleVector *pDVar9;
  ulong extraout_RAX_01;
  Int64Vector *this_03;
  ulong extraout_RAX_02;
  undefined8 *puVar10;
  char *field_name;
  char cVar11;
  int size;
  ulong uVar12;
  _func_int **data;
  undefined4 uVar13;
  pair<unsigned_long,_bool> pVar14;
  pair<unsigned_long,_bool> pVar15;
  ImputedValueUnion local_48;
  uint8 **local_40;
  ReplaceValueUnion *local_38;
  
  local_40 = &input->buffer_end_;
  local_38 = &this->ReplaceValue_;
  this_00 = &this->ImputedValue_;
  do {
    pbVar3 = input->buffer_;
    uVar8 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar8 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_001dbfac;
      input->buffer_ = pbVar3 + 1;
      uVar12 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_001dbfac:
      uVar8 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar8);
      uVar12 = 0;
      if (uVar8 - 1 < 0x7f) {
        uVar12 = 0x100000000;
      }
      uVar12 = uVar8 | uVar12;
    }
    uVar8 = (uint32)uVar12;
    if ((uVar12 & 0x100000000) == 0) goto switchD_001dc017_caseD_8;
    cVar11 = (char)uVar12;
    switch((uint)(uVar12 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar11 != '\t') break;
      clear_ImputedValue(this);
      pIVar4 = (ImputedValueUnion *)input->buffer_;
      if (7 < *(int *)&input->buffer_end_ - (int)pIVar4) {
        local_48 = *pIVar4;
        input->buffer_ = (uint8 *)(pIVar4 + 1);
LAB_001dc046:
        this->ImputedValue_ = local_48;
        this->_oneof_case_[0] = 1;
        goto LAB_001dbff7;
      }
      bVar7 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                        (input,(uint64 *)&local_48.imputedint64value_);
      if (bVar7) goto LAB_001dc046;
      goto LAB_001dc3f6;
    case 2:
      if (cVar11 != '\x10') break;
      clear_ImputedValue(this);
      puVar5 = input->buffer_;
      if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar5 + 1;
        pVar14._8_8_ = 1;
        pVar14.first = (long)(char)uVar2;
      }
      else {
        pVar14 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      uVar13 = 6;
      if (((undefined1  [16])pVar14 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        (this->ImputedValue_).imputedint64value_ = pVar14.first;
        this->_oneof_case_[0] = 2;
        goto LAB_001dbff7;
      }
      goto LAB_001dbffa;
    case 3:
      if (cVar11 == '\x1a') {
        if (this->_oneof_case_[0] != 3) {
          clear_ImputedValue(this);
          this->_oneof_case_[0] = 3;
          (this->ImputedValue_).imputeddoublevalue_ =
               (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
        }
        if ((undefined8 *)this_00->imputedint64value_ ==
            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (&this_00->imputedstringvalue_,
                     (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar7 = google::protobuf::internal::WireFormatLite::ReadBytes
                          (input,(string *)this_00->imputeddoublearray_);
        uVar13 = 6;
        if (bVar7) {
          pDVar9 = (DoubleVector *)
                   &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
          if (this->_oneof_case_[0] == 3) {
            pDVar9 = (this->ImputedValue_).imputeddoublearray_;
          }
          data = (pDVar9->super_MessageLite)._vptr_MessageLite;
          size = *(int *)&(pDVar9->_internal_metadata_).
                          super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
                          .ptr_;
          field_name = "CoreML.Specification.Imputer.imputedStringValue";
LAB_001dc33e:
          uVar13 = 6;
          bVar7 = google::protobuf::internal::WireFormatLite::VerifyUtf8String
                            ((char *)data,size,PARSE,field_name);
          if (bVar7) goto LAB_001dbff7;
        }
        goto LAB_001dbffa;
      }
      break;
    case 4:
      if (cVar11 == '\"') {
        if (this->_oneof_case_[0] != 4) {
          clear_ImputedValue(this);
          this->_oneof_case_[0] = 4;
          pDVar9 = (DoubleVector *)operator_new(0x28);
          DoubleVector::DoubleVector(pDVar9);
          (this->ImputedValue_).imputeddoublearray_ = pDVar9;
        }
        MergePartialFromCodedStream();
        uVar12 = extraout_RAX_01;
LAB_001dc2a5:
        if ((uVar12 & 1) == 0) goto LAB_001dbff7;
        uVar13 = local_48.imputedint64value_._0_4_;
        goto LAB_001dbffa;
      }
      break;
    case 5:
      if (cVar11 == '*') {
        if (this->_oneof_case_[0] != 5) {
          clear_ImputedValue(this);
          this->_oneof_case_[0] = 5;
          this_03 = (Int64Vector *)operator_new(0x28);
          Int64Vector::Int64Vector(this_03);
          (this->ImputedValue_).imputedint64array_ = this_03;
        }
        MergePartialFromCodedStream();
        uVar12 = extraout_RAX_02;
        goto LAB_001dc2a5;
      }
      break;
    case 6:
      if (cVar11 == '2') {
        if (this->_oneof_case_[0] != 6) {
          clear_ImputedValue(this);
          this->_oneof_case_[0] = 6;
          this_01 = (StringToDoubleMap *)operator_new(0x38);
          StringToDoubleMap::StringToDoubleMap(this_01);
          (this->ImputedValue_).imputedstringdictionary_ = this_01;
        }
        MergePartialFromCodedStream();
        uVar12 = extraout_RAX;
        goto LAB_001dc2a5;
      }
      break;
    case 7:
      if (cVar11 == ':') {
        if (this->_oneof_case_[0] != 7) {
          clear_ImputedValue(this);
          this->_oneof_case_[0] = 7;
          this_02 = (Int64ToDoubleMap *)operator_new(0x38);
          Int64ToDoubleMap::Int64ToDoubleMap(this_02);
          (this->ImputedValue_).imputedint64dictionary_ = this_02;
        }
        MergePartialFromCodedStream();
        uVar12 = extraout_RAX_00;
        goto LAB_001dc2a5;
      }
      break;
    case 0xb:
      if (cVar11 != 'Y') break;
      clear_ReplaceValue(this);
      pIVar4 = (ImputedValueUnion *)input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)pIVar4 < 8) {
        bVar7 = google::protobuf::io::CodedInputStream::ReadLittleEndian64Fallback
                          (input,(uint64 *)&local_48.imputedint64value_);
        if (!bVar7) goto LAB_001dc3f6;
      }
      else {
        local_48 = *pIVar4;
        input->buffer_ = (uint8 *)(pIVar4 + 1);
      }
      this->ReplaceValue_ = (ReplaceValueUnion)local_48;
      this->_oneof_case_[1] = 0xb;
      goto LAB_001dbff7;
    case 0xc:
      if (cVar11 == '`') {
        clear_ReplaceValue(this);
        puVar5 = input->buffer_;
        if ((puVar5 < input->buffer_end_) && (uVar2 = *puVar5, -1 < (long)(char)uVar2)) {
          input->buffer_ = puVar5 + 1;
          pVar15._8_8_ = 1;
          pVar15.first = (long)(char)uVar2;
        }
        else {
          pVar15 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
        }
        uVar13 = 6;
        if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
          (this->ReplaceValue_).replaceint64value_ = pVar15.first;
          this->_oneof_case_[1] = 0xc;
          goto LAB_001dbff7;
        }
        goto LAB_001dbffa;
      }
      break;
    case 0xd:
      if (cVar11 == 'j') {
        if (this->_oneof_case_[1] != 0xd) {
          clear_ReplaceValue(this);
          this->_oneof_case_[1] = 0xd;
          (this->ReplaceValue_).replacedoublevalue_ =
               (double)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
        }
        pRVar6 = local_38;
        if ((undefined8 *)local_38->replaceint64value_ ==
            &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
          google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena
                    (&local_38->replacestringvalue_,
                     (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_);
        }
        bVar7 = google::protobuf::internal::WireFormatLite::ReadBytes
                          (input,(string *)*(ArenaStringPtr *)pRVar6);
        uVar13 = 6;
        if (bVar7) {
          puVar10 = &google::protobuf::internal::fixed_address_empty_string_abi_cxx11_;
          if (this->_oneof_case_[1] == 0xd) {
            puVar10 = (undefined8 *)(this->ReplaceValue_).replaceint64value_;
          }
          data = (_func_int **)*puVar10;
          size = *(int *)(puVar10 + 1);
          field_name = "CoreML.Specification.Imputer.replaceStringValue";
          goto LAB_001dc33e;
        }
        goto LAB_001dbffa;
      }
    }
switchD_001dc017_caseD_8:
    uVar13 = 7;
    if ((uVar8 & 7) != 4 && uVar8 != 0) {
      bVar7 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar8);
      if (bVar7) {
LAB_001dbff7:
        uVar13 = 0;
      }
      else {
LAB_001dc3f6:
        uVar13 = 6;
      }
    }
LAB_001dbffa:
    if (uVar13 != 0) {
      return uVar13 != 6;
    }
  } while( true );
}

Assistant:

bool Imputer::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.Imputer)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // double imputedDoubleValue = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(9u)) {
          clear_ImputedValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &ImputedValue_.imputeddoublevalue_)));
          set_has_imputeddoublevalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 imputedInt64Value = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(16u)) {
          clear_ImputedValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &ImputedValue_.imputedint64value_)));
          set_has_imputedint64value();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string imputedStringValue = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(26u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_imputedstringvalue()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->imputedstringvalue().data(), this->imputedstringvalue().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Imputer.imputedStringValue"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.DoubleVector imputedDoubleArray = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(34u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputeddoublearray()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector imputedInt64Array = 5;
      case 5: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(42u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputedint64array()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringToDoubleMap imputedStringDictionary = 6;
      case 6: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(50u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputedstringdictionary()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64ToDoubleMap imputedInt64Dictionary = 7;
      case 7: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(58u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_imputedint64dictionary()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // double replaceDoubleValue = 11;
      case 11: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(89u)) {
          clear_ReplaceValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, &ReplaceValue_.replacedoublevalue_)));
          set_has_replacedoublevalue();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // int64 replaceInt64Value = 12;
      case 12: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(96u)) {
          clear_ReplaceValue();
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::int64, ::google::protobuf::internal::WireFormatLite::TYPE_INT64>(
                 input, &ReplaceValue_.replaceint64value_)));
          set_has_replaceint64value();
        } else {
          goto handle_unusual;
        }
        break;
      }

      // string replaceStringValue = 13;
      case 13: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(106u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadString(
                input, this->mutable_replacestringvalue()));
          DO_(::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
            this->replacestringvalue().data(), this->replacestringvalue().length(),
            ::google::protobuf::internal::WireFormatLite::PARSE,
            "CoreML.Specification.Imputer.replaceStringValue"));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.Imputer)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.Imputer)
  return false;
#undef DO_
}